

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_abs_sparc64
               (TCGContext_conflict8 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz)

{
  uint32_t maxsz_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  tcg_gen_gvec_2_sparc64(tcg_ctx,dofs,aofs,oprsz,maxsz,tcg_gen_gvec_abs_sparc64::g + vece);
  return;
}

Assistant:

void tcg_gen_gvec_abs(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                      uint32_t oprsz, uint32_t maxsz)
{
    static const TCGOpcode vecop_list[] = { INDEX_op_abs_vec, 0 };
    static const GVecGen2 g[4] = {
        { .fni8 = tcg_gen_vec_abs8_i64,
          .fniv = tcg_gen_abs_vec,
          .fno = gen_helper_gvec_abs8,
          .opt_opc = vecop_list,
          .vece = MO_8 },
        { .fni8 = tcg_gen_vec_abs16_i64,
          .fniv = tcg_gen_abs_vec,
          .fno = gen_helper_gvec_abs16,
          .opt_opc = vecop_list,
          .vece = MO_16 },
        { .fni4 = tcg_gen_abs_i32,
          .fniv = tcg_gen_abs_vec,
          .fno = gen_helper_gvec_abs32,
          .opt_opc = vecop_list,
          .vece = MO_32 },
        { .fni8 = tcg_gen_abs_i64,
          .fniv = tcg_gen_abs_vec,
          .fno = gen_helper_gvec_abs64,
          .opt_opc = vecop_list,
          .prefer_i64 = TCG_TARGET_REG_BITS == 64,
          .vece = MO_64 },
    };

    tcg_debug_assert(vece <= MO_64);
    tcg_gen_gvec_2(tcg_ctx, dofs, aofs, oprsz, maxsz, &g[vece]);
}